

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  cmState *this_00;
  bool bVar1;
  bool bVar2;
  char *__s;
  string *psVar3;
  bool collapse;
  bool collapse_00;
  string path;
  string cacheFile;
  string listFile;
  string listPath;
  string cachePath;
  
  listPath._M_dataplus._M_p = (pointer)&listPath.field_2;
  listPath._M_string_length = 0;
  listPath.field_2._M_local_buf[0] = '\0';
  cachePath._M_dataplus._M_p = (pointer)&cachePath.field_2;
  cachePath._M_string_length = 0;
  cachePath.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&path,arg);
    cmsys::SystemTools::ConvertToUnixSlashes(&path);
    std::__cxx11::string::string((string *)&cacheFile,(string *)&path);
    std::__cxx11::string::append((char *)&cacheFile);
    std::__cxx11::string::string((string *)&listFile,(string *)&path);
    std::__cxx11::string::append((char *)&listFile);
    bVar1 = cmsys::SystemTools::FileExists(&cacheFile);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&cachePath);
    }
    bVar1 = cmsys::SystemTools::FileExists(&listFile);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&listPath);
    }
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::~string((string *)&cacheFile);
    std::__cxx11::string::~string((string *)&path);
    bVar1 = false;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(arg);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath(&path,arg);
      cmsys::SystemTools::GetFilenameName(&cacheFile,&path);
      cmsys::SystemTools::LowerCase(&listFile,&cacheFile);
      std::__cxx11::string::operator=((string *)&cacheFile,(string *)&listFile);
      std::__cxx11::string::~string((string *)&listFile);
      bVar1 = std::operator==(&cacheFile,"cmakecache.txt");
      if (bVar1) {
        cmsys::SystemTools::GetFilenamePath(&listFile,&path);
        psVar3 = &cachePath;
LAB_001781e3:
        std::__cxx11::string::operator=((string *)psVar3,(string *)&listFile);
        std::__cxx11::string::~string((string *)&listFile);
      }
      else {
        bVar1 = std::operator==(&cacheFile,"cmakelists.txt");
        if (bVar1) {
          cmsys::SystemTools::GetFilenamePath(&listFile,&path);
          psVar3 = &listPath;
          goto LAB_001781e3;
        }
      }
      std::__cxx11::string::~string((string *)&cacheFile);
      std::__cxx11::string::~string((string *)&path);
      bVar1 = true;
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&path,arg);
      cmsys::SystemTools::GetFilenameName(&cacheFile,&path);
      cmsys::SystemTools::LowerCase(&listFile,&cacheFile);
      std::__cxx11::string::operator=((string *)&cacheFile,(string *)&listFile);
      std::__cxx11::string::~string((string *)&listFile);
      bVar1 = std::operator==(&cacheFile,"cmakecache.txt");
      if (bVar1) {
LAB_00178190:
        cmsys::SystemTools::GetFilenamePath(&listFile,&path);
        std::__cxx11::string::operator=((string *)&listPath,(string *)&listFile);
        std::__cxx11::string::~string((string *)&listFile);
        bVar1 = true;
      }
      else {
        bVar1 = std::operator==(&cacheFile,"cmakelists.txt");
        if (bVar1) goto LAB_00178190;
        std::__cxx11::string::_M_assign((string *)&listPath);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&cacheFile);
      std::__cxx11::string::~string((string *)&path);
    }
  }
  if (cachePath._M_string_length == 0) {
LAB_001782b5:
    if (listPath._M_string_length == 0) {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      if (psVar3->_M_string_length == 0) {
        cmsys::SystemTools::CollapseFullPath(&path,arg);
        SetHomeDirectory(this,&path);
        std::__cxx11::string::~string((string *)&path);
      }
      psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
      if (psVar3->_M_string_length != 0) goto LAB_00178362;
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&path,(SystemTools *)0x1,collapse);
      SetHomeOutputDirectory(this,&path);
    }
    else {
      SetHomeDirectory(this,&listPath);
      if (bVar1) {
        SetHomeOutputDirectory(this,&listPath);
        goto LAB_00178362;
      }
      psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
      if (psVar3->_M_string_length != 0) goto LAB_00178362;
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&path,(SystemTools *)0x1,collapse_00);
      SetHomeOutputDirectory(this,&path);
    }
  }
  else {
    bVar2 = LoadCache(this,&cachePath);
    if (!bVar2) goto LAB_001782b5;
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&cacheFile);
    __s = cmState::GetCacheEntryValue(this_00,&path);
    std::__cxx11::string::~string((string *)&path);
    if (__s == (char *)0x0) goto LAB_001782b5;
    SetHomeOutputDirectory(this,&cachePath);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,__s,(allocator<char> *)&cacheFile);
    SetHomeDirectory(this,&path);
  }
  std::__cxx11::string::~string((string *)&path);
LAB_00178362:
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::~string((string *)&listPath);
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt") {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt") {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt" || name == "cmakelists.txt") {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      const char* existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
      }
    }
  }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    this->SetHomeDirectory(listPath);

    if (argIsFile) {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
    } else {
      // Source directory given on command line.  Use current working
      // directory as build tree if -B hasn't been given already
      if (this->GetHomeOutputDirectory().empty()) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    }
    return;
  }

  if (this->GetHomeDirectory().empty()) {
    // We didn't find a CMakeLists.txt and it wasn't specified
    // with -S. Assume it is the path to the source tree
    std::string full = cmSystemTools::CollapseFullPath(arg);
    this->SetHomeDirectory(full);
  }
  if (this->GetHomeOutputDirectory().empty()) {
    // We didn't find a CMakeCache.txt and it wasn't specified
    // with -B. Assume the current working directory as the build tree.
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    this->SetHomeOutputDirectory(cwd);
  }
}